

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envelope.cc
# Opt level: O0

void __thiscall EnvelopeGenerator::writeCONTROL_REG(EnvelopeGenerator *this,reg8 control)

{
  uint uVar1;
  reg8 gate_next;
  reg8 control_local;
  EnvelopeGenerator *this_local;
  
  uVar1 = control & 1;
  if ((this->gate == 0) && (uVar1 != 0)) {
    this->state = ATTACK;
    this->rate_period = rate_counter_period[this->attack];
    this->hold_zero = false;
  }
  else if ((this->gate != 0) && (uVar1 == 0)) {
    this->state = RELEASE;
    this->rate_period = rate_counter_period[this->release];
  }
  this->gate = uVar1;
  return;
}

Assistant:

void EnvelopeGenerator::writeCONTROL_REG(reg8 control)
{
  reg8 gate_next = control & 0x01;

  // The rate counter is never reset, thus there will be a delay before the
  // envelope counter starts counting up (attack) or down (release).

  // Gate bit on: Start attack, decay, sustain.
  if (!gate && gate_next) {
    state = ATTACK;
    rate_period = rate_counter_period[attack];

    // Switching to attack state unlocks the zero freeze.
    hold_zero = false;
  }
  // Gate bit off: Start release.
  else if (gate && !gate_next) {
    state = RELEASE;
    rate_period = rate_counter_period[release];
  }

  gate = gate_next;
}